

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O0

void __thiscall irr::video::CNullDriver::drawMeshBuffer(CNullDriver *this,IMeshBuffer *mb)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  long lVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  long *in_RSI;
  long *in_RDI;
  SHWBufferLink *HWBuffer;
  
  if (in_RSI != (long *)0x0) {
    lVar6 = (**(code **)(*in_RDI + 0x350))(in_RDI,in_RSI);
    if (lVar6 == 0) {
      uVar7 = (**(code **)(*in_RSI + 0x18))();
      uVar1 = (**(code **)(*in_RSI + 0x28))();
      uVar8 = (**(code **)(*in_RSI + 0x38))();
      uVar2 = (**(code **)(*in_RSI + 0xf0))();
      uVar3 = (**(code **)(*in_RSI + 0x10))();
      uVar4 = (**(code **)(*in_RSI + 0xe8))();
      uVar5 = (**(code **)(*in_RSI + 0x30))();
      (**(code **)(*in_RDI + 0x158))(in_RDI,uVar7,uVar1,uVar8,uVar2,uVar3,uVar4,uVar5);
    }
    else {
      (**(code **)(*in_RDI + 0x360))(in_RDI,lVar6);
    }
  }
  return;
}

Assistant:

void CNullDriver::drawMeshBuffer(const scene::IMeshBuffer *mb)
{
	if (!mb)
		return;

	// IVertexBuffer and IIndexBuffer later
	SHWBufferLink *HWBuffer = getBufferLink(mb);

	if (HWBuffer)
		drawHardwareBuffer(HWBuffer);
	else
		drawVertexPrimitiveList(mb->getVertices(), mb->getVertexCount(), mb->getIndices(), mb->getPrimitiveCount(), mb->getVertexType(), mb->getPrimitiveType(), mb->getIndexType());
}